

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

size_t __thiscall CompiledHeaderList::compiled_size(CompiledHeaderList *this)

{
  uint uVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  CompiledHeaderList *this_local;
  
  cVar2 = std::__cxx11::
          list<eggs::variants::variant<CompiledScmHeader,_CustomHeaderOATC>,_std::allocator<eggs::variants::variant<CompiledScmHeader,_CustomHeaderOATC>_>_>
          ::begin(&this->headers);
  cVar3 = std::__cxx11::
          list<eggs::variants::variant<CompiledScmHeader,_CustomHeaderOATC>,_std::allocator<eggs::variants::variant<CompiledScmHeader,_CustomHeaderOATC>_>_>
          ::end(&this->headers);
  uVar1 = std::
          accumulate<std::_List_const_iterator<eggs::variants::variant<CompiledScmHeader,CustomHeaderOATC>>,unsigned_int,CompiledHeaderList::compiled_size()const::__0>
                    (cVar2._M_node,cVar3._M_node,0);
  return (ulong)uVar1;
}

Assistant:

size_t CompiledHeaderList::compiled_size() const
{
    return std::accumulate(headers.begin(), headers.end(), 0u, [](uint32_t size, const auto& header) {
        return size + visit_one(header, [](const auto& h) { return h.compiled_size(); });
    });
}